

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O1

void duckdb::GeoParquetFileMetadata::GeometryType(void)

{
  LogicalType *in_RDI;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  duckdb::LogicalType::LogicalType(in_RDI,BLOB);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"GEOMETRY","");
  duckdb::LogicalType::SetAlias();
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

LogicalType GeoParquetFileMetadata::GeometryType() {
	auto blob_type = LogicalType(LogicalTypeId::BLOB);
	blob_type.SetAlias("GEOMETRY");
	return blob_type;
}